

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ProgramStateReattachShaderCase::executeForProgram
          (ProgramStateReattachShaderCase *this,Program *program,ShaderAllocator *shaders)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  mapped_type pSVar2;
  mapped_type *ppSVar3;
  char *__s;
  long *plVar4;
  long *plVar5;
  allocator<char> local_209;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pTVar1 = ((this->super_ProgramStateCase).super_ApiCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1a8._0_4_ = (this->super_ProgramStateCase).m_shaderType;
  ppSVar3 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&shaders->m_shaders,(key_type *)local_1a8);
  pSVar2 = *ppSVar3;
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  __s = glu::getShaderTypeName((this->super_ProgramStateCase).m_shaderType);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,__s,&local_209);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1bfa9e5);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1d8 = *plVar5;
    lStack_1d0 = plVar4[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar5;
    local_1e8 = (long *)*plVar4;
  }
  local_1e0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1f8 = *plVar5;
    lStack_1f0 = plVar4[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar5;
    local_208 = (long *)*plVar4;
  }
  local_200 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_208,local_200)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  glu::Program::detachShader(program,pSVar2->m_shader);
  glu::Program::attachShader(program,pSVar2->m_shader);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Reattaching " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		program.detachShader(caseShader.getShader());
		program.attachShader(caseShader.getShader());
	}